

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadSection(CrateReader *this,Section *s)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  ssize_t sVar5;
  uint64_t uVar6;
  ostream *poVar7;
  string local_358;
  ostringstream local_338 [8];
  ostringstream ss_e_1;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream ss_e;
  size_t name_len;
  Section *s_local;
  CrateReader *this_local;
  
  sVar5 = StreamReader::read(this->_sr,0x10,(void *)0x10,(size_t)s);
  if (sVar5 == 0x10) {
    bVar4 = StreamReader::read8(this->_sr,&s->start);
    if (bVar4) {
      uVar1 = s->start;
      uVar6 = StreamReader::size(this->_sr);
      if (uVar6 < uVar1) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a0);
        poVar7 = ::std::operator<<((ostream *)local_1a0,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,"[Crate]");
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReadSection");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1537);
        ::std::operator<<(poVar7," ");
        poVar7 = ::std::operator<<((ostream *)local_1a0,
                                   "Section start offset exceeds USDC file size.");
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_1c0);
        ::std::__cxx11::string::~string((string *)&local_1c0);
        this_local._7_1_ = false;
        ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
      }
      else {
        bVar4 = StreamReader::read8(this->_sr,&s->size);
        if (bVar4) {
          lVar2 = s->start;
          lVar3 = s->size;
          uVar6 = StreamReader::size(this->_sr);
          if (uVar6 < (ulong)(lVar2 + lVar3)) {
            ::std::__cxx11::ostringstream::ostringstream(local_338);
            poVar7 = ::std::operator<<((ostream *)local_338,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,"[Crate]");
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReadSection");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1540);
            ::std::operator<<(poVar7," ");
            poVar7 = ::std::operator<<((ostream *)local_338,
                                       "Section end offset exceeds USDC file size.");
            ::std::operator<<(poVar7,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_358);
            ::std::__cxx11::string::~string((string *)&local_358);
            this_local._7_1_ = false;
            ::std::__cxx11::ostringstream::~ostringstream(local_338);
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          ::std::__cxx11::string::operator+=((string *)&this->_err,"Failed to read section.size.\n")
          ;
          this_local._7_1_ = false;
        }
      }
    }
    else {
      ::std::__cxx11::string::operator+=((string *)&this->_err,"Failed to read section.start.\n");
      this_local._7_1_ = false;
    }
  }
  else {
    ::std::__cxx11::string::operator+=((string *)&this->_err,"Failed to read section.name.\n");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CrateReader::ReadSection(crate::Section *s) {
  size_t name_len = crate::kSectionNameMaxLength + 1;

  if (name_len !=
      _sr->read(name_len, name_len, reinterpret_cast<uint8_t *>(s->name))) {
    _err += "Failed to read section.name.\n";
    return false;
  }

  if (!_sr->read8(&s->start)) {
    _err += "Failed to read section.start.\n";
    return false;
  }

  if (size_t(s->start) > _sr->size()) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Section start offset exceeds USDC file size.");
  }

  if (!_sr->read8(&s->size)) {
    _err += "Failed to read section.size.\n";
    return false;
  }

  if (size_t(s->start + s->size) > _sr->size()) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Section end offset exceeds USDC file size.");
  }


  return true;
}